

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

BCLine lj_debug_line(GCproto *pt,BCPos pc)

{
  uint64_t uVar1;
  uint uVar2;
  BCLine first;
  void *lineinfo;
  BCPos pc_local;
  GCproto *pt_local;
  
  uVar1 = (pt->lineinfo).ptr64;
  if ((pt->sizebc < pc) || (uVar1 == 0)) {
    pt_local._4_4_ = 0;
  }
  else {
    pt_local._4_4_ = pt->firstline;
    if (pc == pt->sizebc) {
      pt_local._4_4_ = pt_local._4_4_ + pt->numline;
    }
    else {
      uVar2 = pc - 1;
      if (pc != 0) {
        if (pt->numline < 0x100) {
          pt_local._4_4_ = pt_local._4_4_ + (uint)*(byte *)(uVar1 + uVar2);
        }
        else if (pt->numline < 0x10000) {
          pt_local._4_4_ = pt_local._4_4_ + (uint)*(ushort *)(uVar1 + (ulong)uVar2 * 2);
        }
        else {
          pt_local._4_4_ = pt_local._4_4_ + *(int *)(uVar1 + (ulong)uVar2 * 4);
        }
      }
    }
  }
  return pt_local._4_4_;
}

Assistant:

BCLine LJ_FASTCALL lj_debug_line(GCproto *pt, BCPos pc)
{
  const void *lineinfo = proto_lineinfo(pt);
  if (pc <= pt->sizebc && lineinfo) {
    BCLine first = pt->firstline;
    if (pc == pt->sizebc) return first + pt->numline;
    if (pc-- == 0) return first;
    if (pt->numline < 256)
      return first + (BCLine)((const uint8_t *)lineinfo)[pc];
    else if (pt->numline < 65536)
      return first + (BCLine)((const uint16_t *)lineinfo)[pc];
    else
      return first + (BCLine)((const uint32_t *)lineinfo)[pc];
  }
  return 0;
}